

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_value_store.cpp
# Opt level: O0

pair<bool,_const_FlaggedValue_&> __thiscall
KeyValueStore::get(KeyValueStore *this,vector<char,_std::allocator<char>_> *key)

{
  undefined8 extraout_RAX;
  pair<bool,_FlaggedValue_&> pVar1;
  pair<bool,_const_FlaggedValue_&> pVar2;
  lock_guard<std::mutex> lk;
  FlaggedValue *in_stack_ffffffffffffff78;
  unordered_map<std::vector<char,_std::allocator<char>_>,_FlaggedValue,_std::hash<std::vector<char,_std::allocator<char>_>_>,_std::equal_to<std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::vector<char,_std::allocator<char>_>,_FlaggedValue>_>_>
  *in_stack_ffffffffffffff80;
  pair<bool,_FlaggedValue_&> local_38 [2];
  pair<bool,_const_FlaggedValue_&> local_10;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff80,
             (mutex_type *)in_stack_ffffffffffffff78);
  std::
  unordered_map<std::vector<char,_std::allocator<char>_>,_FlaggedValue,_std::hash<std::vector<char,_std::allocator<char>_>_>,_std::equal_to<std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::vector<char,_std::allocator<char>_>,_FlaggedValue>_>_>
  ::count(in_stack_ffffffffffffff80,&in_stack_ffffffffffffff78->value);
  std::
  unordered_map<std::vector<char,_std::allocator<char>_>,_FlaggedValue,_std::hash<std::vector<char,_std::allocator<char>_>_>,_std::equal_to<std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::vector<char,_std::allocator<char>_>,_FlaggedValue>_>_>
  ::operator[](in_stack_ffffffffffffff80,&in_stack_ffffffffffffff78->value);
  std::ref<FlaggedValue>(in_stack_ffffffffffffff78);
  pVar1 = std::make_pair<bool,std::reference_wrapper<FlaggedValue>>
                    ((bool *)in_stack_ffffffffffffff80,
                     (reference_wrapper<FlaggedValue> *)in_stack_ffffffffffffff78);
  local_38[0].second = pVar1.second;
  local_38[0].first = pVar1.first;
  std::pair<bool,_const_FlaggedValue_&>::pair<bool,_FlaggedValue_&,_true>(&local_10,local_38);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x15f5fc);
  pVar2._1_7_ = (undefined7)((ulong)extraout_RAX >> 8);
  pVar2.first = local_10.first;
  pVar2.second = local_10.second;
  return pVar2;
}

Assistant:

std::pair<bool, const FlaggedValue&> KeyValueStore::get(
    const std::vector<char>& key) {
  std::lock_guard<std::mutex> lk(mut);
  return std::make_pair(data.count(key) > 0, std::ref(data[key]));
}